

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O1

int lws_ssl_client_bio_create(lws *wsi)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  SSL *pSVar4;
  undefined8 uVar5;
  size_t sVar6;
  BIO *rbio;
  lws_system_blob_t *plVar7;
  size_t sVar8;
  char *pcVar9;
  uint8_t *data;
  char hostname [128];
  uint8_t openssl_alpn [40];
  uchar *local_e0;
  char local_d8 [128];
  uint8_t local_58 [48];
  
  if (wsi->stash == (client_info_stash *)0x0) {
    pcVar9 = (((wsi->a).context)->tls).alpn_default;
    iVar1 = lws_hdr_copy(wsi,local_d8,0x80,_WSI_TOKEN_CLIENT_HOST);
    if (iVar1 < 1) {
      _lws_log(1,"%s: Unable to get hostname\n","lws_ssl_client_bio_create");
      return -1;
    }
  }
  else {
    lws_strncpy(local_d8,wsi->stash->cis[2],0x80);
    pcVar9 = wsi->stash->cis[7];
  }
  for (pcVar3 = local_d8; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
    if (*pcVar3 == ':') {
      *pcVar3 = '\0';
      break;
    }
  }
  pSVar4 = SSL_new((SSL_CTX *)(((wsi->a).vhost)->tls).ssl_client_ctx);
  (wsi->tls).ssl = (lws_tls_conn *)pSVar4;
  if (pSVar4 == (SSL *)0x0) {
    iVar1 = lws_ssl_get_error(wsi,0);
    pcVar9 = ERR_error_string((long)iVar1,(char *)0x0);
    _lws_log(1,"SSL_new failed: %s\n",pcVar9);
    lws_tls_err_describe_clear();
    return -1;
  }
  if ((((wsi->a).vhost)->options & 0x8000000000) == 0) {
    lws_tls_reuse_session(wsi);
  }
  if ((((wsi->a).vhost)->tls).ssl_info_event_mask != 0) {
    SSL_set_info_callback((SSL *)(wsi->tls).ssl,lws_ssl_info_callback);
  }
  if (((wsi->tls).use_ssl & 4) == 0) {
    uVar5 = SSL_get0_param((wsi->tls).ssl);
    X509_VERIFY_PARAM_set_hostflags(uVar5,4);
    iVar1 = X509_VERIFY_PARAM_set1_ip_asc(uVar5,local_d8);
    if (iVar1 == 0) {
      sVar6 = strnlen(local_d8,0x80);
      X509_VERIFY_PARAM_set1_host(uVar5,local_d8,sVar6);
    }
  }
  SSL_set_verify((SSL *)(wsi->tls).ssl,1,OpenSSL_client_verify_callback);
  SSL_ctrl((SSL *)(wsi->tls).ssl,0x21,2,(void *)0x0);
  SSL_ctrl((SSL *)(wsi->tls).ssl,0x37,0,local_d8);
  rbio = BIO_new_socket((wsi->desc).sockfd,0);
  (wsi->tls).client_bio = (lws_tls_bio *)rbio;
  SSL_set_bio((SSL *)(wsi->tls).ssl,rbio,rbio);
  BIO_ctrl((BIO *)(wsi->tls).client_bio,0x66,1,(void *)0x0);
  pcVar3 = (((wsi->a).vhost)->tls).alpn;
  if (pcVar3 != (char *)0x0) {
    pcVar9 = pcVar3;
  }
  if (wsi->stash != (client_info_stash *)0x0) {
    pcVar9 = wsi->stash->cis[7];
  }
  iVar1 = lws_hdr_copy(wsi,local_d8,0x80,_WSI_TOKEN_CLIENT_ALPN);
  if (0 < iVar1) {
    pcVar9 = local_d8;
  }
  _lws_log(8,"%s client conn using alpn list \'%s\'\n",wsi->role_ops->name,pcVar9);
  iVar1 = lws_alpn_comma_to_openssl(pcVar9,local_58,0x27);
  SSL_set_alpn_protos((wsi->tls).ssl,local_58,iVar1);
  SSL_set_ex_data((SSL *)(wsi->tls).ssl,openssl_websocket_private_data_index,wsi);
  if (wsi->sys_tls_client_cert == 0) {
    return 0;
  }
  plVar7 = lws_system_get_blob((wsi->a).context,LWS_SYSBLOB_TYPE_CLIENT_CERT_DER,
                               wsi->sys_tls_client_cert - 1);
  iVar1 = 4;
  if (((plVar7 == (lws_system_blob_t *)0x0) ||
      (sVar8 = lws_system_blob_get_size(plVar7), sVar8 == 0)) ||
     (iVar2 = lws_system_blob_get_single_ptr(plVar7,&local_e0), iVar2 != 0)) goto LAB_001148e6;
  iVar2 = SSL_use_certificate_ASN1((SSL *)(wsi->tls).ssl,local_e0,(int)sVar8);
  if (iVar2 == 1) {
    plVar7 = lws_system_get_blob((wsi->a).context,LWS_SYSBLOB_TYPE_CLIENT_KEY_DER,
                                 wsi->sys_tls_client_cert - 1);
    if (((plVar7 == (lws_system_blob_t *)0x0) ||
        (sVar8 = lws_system_blob_get_size(plVar7), sVar8 == 0)) ||
       (iVar2 = lws_system_blob_get_single_ptr(plVar7,&local_e0), iVar2 != 0)) goto LAB_001148e6;
    iVar1 = SSL_use_PrivateKey_ASN1(6,(SSL *)(wsi->tls).ssl,local_e0,(long)(int)sVar8);
    if ((iVar1 != 1) &&
       (iVar1 = SSL_use_PrivateKey_ASN1(0x198,(SSL *)(wsi->tls).ssl,local_e0,(long)(int)sVar8),
       iVar1 != 1)) {
      pcVar9 = "%s: use_privkey failed\n";
      goto LAB_001148ce;
    }
    iVar1 = SSL_check_private_key((SSL *)(wsi->tls).ssl);
    if (iVar1 == 1) {
      iVar1 = 0;
      _lws_log(4,"%s: set system client cert %u\n","lws_ssl_client_bio_create",
               (ulong)(wsi->sys_tls_client_cert - 1));
      goto LAB_001148e6;
    }
    _lws_log(1,"Private SSL key doesn\'t match cert\n");
    iVar1 = 1;
  }
  else {
    pcVar9 = "%s: use_certificate failed\n";
LAB_001148ce:
    _lws_log(1,pcVar9,"lws_ssl_client_bio_create");
    iVar1 = 4;
  }
  lws_tls_err_describe_clear();
LAB_001148e6:
  if (iVar1 == 4) {
    _lws_log(1,"%s: unable to set up system client cert %d\n","lws_ssl_client_bio_create",
             (ulong)(wsi->sys_tls_client_cert - 1));
    return 1;
  }
  if (iVar1 == 0) {
    return 0;
  }
  return 1;
}

Assistant:

int
lws_ssl_client_bio_create(struct lws *wsi)
{
	char hostname[128], *p;
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	uint8_t openssl_alpn[40];
	const char *alpn_comma = wsi->a.context->tls.alpn_default;
	int n;
#endif

	if (wsi->stash) {
		lws_strncpy(hostname, wsi->stash->cis[CIS_HOST], sizeof(hostname));
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
		alpn_comma = wsi->stash->cis[CIS_ALPN];
#endif
	} else {
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		if (lws_hdr_copy(wsi, hostname, sizeof(hostname),
				 _WSI_TOKEN_CLIENT_HOST) <= 0)
#endif
		{
			lwsl_err("%s: Unable to get hostname\n", __func__);

			return -1;
		}
	}

	/*
	 * remove any :port part on the hostname... necessary for network
	 * connection but typical certificates do not contain it
	 */
	p = hostname;
	while (*p) {
		if (*p == ':') {
			*p = '\0';
			break;
		}
		p++;
	}

	wsi->tls.ssl = SSL_new(wsi->a.vhost->tls.ssl_client_ctx);
	if (!wsi->tls.ssl) {
		const char *es = ERR_error_string(
#if defined(LWS_WITH_BORINGSSL)
	(uint32_t)
#else
	(unsigned long)
#endif
	lws_ssl_get_error(wsi, 0), NULL);
		lwsl_err("SSL_new failed: %s\n", es);
		lws_tls_err_describe_clear();
		return -1;
	}

#if defined(LWS_WITH_TLS_SESSIONS)
	if (!(wsi->a.vhost->options & LWS_SERVER_OPTION_DISABLE_TLS_SESSION_CACHE))
		lws_tls_reuse_session(wsi);
#endif

#if defined (LWS_HAVE_SSL_SET_INFO_CALLBACK)
	if (wsi->a.vhost->tls.ssl_info_event_mask)
		SSL_set_info_callback(wsi->tls.ssl, lws_ssl_info_callback);
#endif

#if defined(LWS_HAVE_X509_VERIFY_PARAM_set1_host)
	if (!(wsi->tls.use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)) {
#if !defined(USE_WOLFSSL)

		X509_VERIFY_PARAM *param = SSL_get0_param(wsi->tls.ssl);

		/* Enable automatic hostname checks */
		X509_VERIFY_PARAM_set_hostflags(param,
					X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS);
		/* Handle the case where the hostname is an IP address */
		if (!X509_VERIFY_PARAM_set1_ip_asc(param, hostname))
			X509_VERIFY_PARAM_set1_host(param, hostname,
					strnlen(hostname, sizeof(hostname)));
#endif

	}
#else
	if (!(wsi->tls.use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)) {
		lwsl_err("%s: your tls lib is too old to have "
			 "X509_VERIFY_PARAM_set1_host, failing all client tls\n",
			 __func__);
		return -1;
	}
#endif

#if !defined(USE_WOLFSSL)
#ifndef USE_OLD_CYASSL
	/* OpenSSL_client_verify_callback will be called @ SSL_connect() */
	SSL_set_verify(wsi->tls.ssl, SSL_VERIFY_PEER,
		       OpenSSL_client_verify_callback);
#endif
#endif

#if !defined(USE_WOLFSSL)
	SSL_set_mode(wsi->tls.ssl,  SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER);
#endif
	/*
	 * use server name indication (SNI), if supported,
	 * when establishing connection
	 */
#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
#ifdef CYASSL_SNI_HOST_NAME
	CyaSSL_UseSNI(wsi->tls.ssl, CYASSL_SNI_HOST_NAME, hostname,
		      strlen(hostname));
#endif
#else
#ifdef WOLFSSL_SNI_HOST_NAME
	wolfSSL_UseSNI(wsi->tls.ssl, WOLFSSL_SNI_HOST_NAME, hostname,
		       strlen(hostname));
#endif
#endif
#else
#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
	SSL_set_tlsext_host_name(wsi->tls.ssl, hostname);
#endif
#endif

#ifdef USE_WOLFSSL
	/*
	 * wolfSSL/CyaSSL does certificate verification differently
	 * from OpenSSL.
	 * If we should ignore the certificate, we need to set
	 * this before SSL_new and SSL_connect is called.
	 * Otherwise the connect will simply fail with error code -155
	 */
#ifdef USE_OLD_CYASSL
	if (wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED)
		CyaSSL_set_verify(wsi->tls.ssl, SSL_VERIFY_NONE, NULL);
#else
	if (wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED)
		wolfSSL_set_verify(wsi->tls.ssl, SSL_VERIFY_NONE, NULL);
#endif
#endif /* USE_WOLFSSL */

	wsi->tls.client_bio = BIO_new_socket((int)(lws_intptr_t)wsi->desc.sockfd,
					     BIO_NOCLOSE);
	SSL_set_bio(wsi->tls.ssl, wsi->tls.client_bio, wsi->tls.client_bio);

#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
	CyaSSL_set_using_nonblock(wsi->tls.ssl, 1);
#else
	wolfSSL_set_using_nonblock(wsi->tls.ssl, 1);
#endif
#else
	BIO_set_nbio(wsi->tls.client_bio, 1); /* nonblocking */
#endif

#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	if (wsi->a.vhost->tls.alpn)
		alpn_comma = wsi->a.vhost->tls.alpn;
	if (wsi->stash)
		alpn_comma = wsi->stash->cis[CIS_ALPN];
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (lws_hdr_copy(wsi, hostname, sizeof(hostname),
			 _WSI_TOKEN_CLIENT_ALPN) > 0)
		alpn_comma = hostname;
#endif

	lwsl_info("%s client conn using alpn list '%s'\n", wsi->role_ops->name, alpn_comma);

	n = lws_alpn_comma_to_openssl(alpn_comma, openssl_alpn,
				      sizeof(openssl_alpn) - 1);

	SSL_set_alpn_protos(wsi->tls.ssl, openssl_alpn, (unsigned int)n);
#endif

	SSL_set_ex_data(wsi->tls.ssl, openssl_websocket_private_data_index,
			wsi);

	if (wsi->sys_tls_client_cert) {
		lws_system_blob_t *b = lws_system_get_blob(wsi->a.context,
					LWS_SYSBLOB_TYPE_CLIENT_CERT_DER,
					wsi->sys_tls_client_cert - 1);
		const uint8_t *data;
		size_t size;

		if (!b)
			goto no_client_cert;

		/*
		 * Set up the per-connection client cert
		 */

		size = lws_system_blob_get_size(b);
		if (!size)
			goto no_client_cert;

		if (lws_system_blob_get_single_ptr(b, &data))
			goto no_client_cert;

		if (SSL_use_certificate_ASN1(wsi->tls.ssl,
#if defined(USE_WOLFSSL)
			(unsigned char *)
#endif
					data,
#if defined(LWS_WITH_BORINGSSL)
					(size_t)
#else
					(int)
#endif
					size) != 1) {
			lwsl_err("%s: use_certificate failed\n", __func__);
			lws_tls_err_describe_clear();
			goto no_client_cert;
		}

		b = lws_system_get_blob(wsi->a.context,
					LWS_SYSBLOB_TYPE_CLIENT_KEY_DER,
					wsi->sys_tls_client_cert - 1);
		if (!b)
			goto no_client_cert;

		size = lws_system_blob_get_size(b);
		if (!size)
			goto no_client_cert;

		if (lws_system_blob_get_single_ptr(b, &data))
			goto no_client_cert;

		if (SSL_use_PrivateKey_ASN1(EVP_PKEY_RSA, wsi->tls.ssl,
#if defined(USE_WOLFSSL)
			(unsigned char *)
#endif

					    data,
#if defined(LWS_WITH_BORINGSSL)
					(size_t)
#else
					(int)
#endif
					    size) != 1 &&
		    SSL_use_PrivateKey_ASN1(EVP_PKEY_EC, wsi->tls.ssl,
#if defined(USE_WOLFSSL)
			(unsigned char *)
#endif
					    data,
#if defined(LWS_WITH_BORINGSSL)
					(size_t)
#else
					(int)
#endif
					    size) != 1) {
			lwsl_err("%s: use_privkey failed\n", __func__);
			lws_tls_err_describe_clear();
			goto no_client_cert;
		}

		if (SSL_check_private_key(wsi->tls.ssl) != 1) {
			lwsl_err("Private SSL key doesn't match cert\n");
			lws_tls_err_describe_clear();
			return 1;
		}

		lwsl_notice("%s: set system client cert %u\n", __func__,
				wsi->sys_tls_client_cert - 1);
	}

	return 0;

no_client_cert:
	lwsl_err("%s: unable to set up system client cert %d\n", __func__,
			wsi->sys_tls_client_cert - 1);

	return 1;
}